

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytocsv.cpp
# Opt level: O3

void doit(bool skipheader,bool index_file)

{
  long lVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  FILE *__stream;
  FILE *__stream_00;
  size_t sVar5;
  undefined8 extraout_RAX;
  bool bVar6;
  char *___argv;
  undefined7 in_register_00000039;
  char *pcVar7;
  bool index_file_00;
  long lVar8;
  bool skipheader_00;
  VulnerabilityRow row;
  VulnerabilityIndex idx;
  string sStack_d8;
  string sStack_b8;
  FILE *pFStack_98;
  uint local_60;
  uint local_5c;
  float local_58;
  uint local_54;
  uint local_50;
  uint uStack_4c;
  float local_48;
  undefined4 uStack_44;
  FILE *local_38;
  
  if ((int)CONCAT71(in_register_00000039,skipheader) == 0) {
    puts("vulnerability_id,intensity_bin_id,damage_bin_id,probability");
  }
  if (index_file) {
    __stream = fopen("vulnerability.bin","rb");
    pcVar7 = "vulnerability.idx";
    ___argv = "rb";
    __stream_00 = fopen("vulnerability.idx","rb");
    if (__stream_00 == (FILE *)0x0) {
      doit();
      skipheader_00 = false;
      index_file_00 = false;
      pFStack_98 = __stream;
      bVar3 = false;
      while( true ) {
        while( true ) {
          do {
            bVar6 = bVar3;
            iVar4 = getopt((int)pcVar7,(char **)___argv,"vhsiz");
            bVar3 = true;
          } while (iVar4 == 0x7a);
          if (0x72 < iVar4) break;
          if (iVar4 == -1) {
            sStack_b8._M_dataplus._M_p = (pointer)&sStack_b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b8,"","");
            sStack_d8._M_dataplus._M_p = (pointer)&sStack_d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_d8,"","");
            initstreams(&sStack_b8,&sStack_d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_d8._M_dataplus._M_p != &sStack_d8.field_2) {
              operator_delete(sStack_d8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_b8._M_dataplus._M_p != &sStack_b8.field_2) {
              operator_delete(sStack_b8._M_dataplus._M_p);
            }
            if (bVar6) {
              doitz(skipheader_00);
            }
            else {
              doit(skipheader_00,index_file_00);
            }
            return;
          }
          if (iVar4 != 0x69) goto LAB_00101766;
          index_file_00 = true;
          bVar3 = bVar6;
        }
        if (iVar4 != 0x73) break;
        skipheader_00 = true;
        bVar3 = bVar6;
      }
      if (iVar4 == 0x76) {
        main_cold_1();
      }
LAB_00101766:
      main_cold_2();
      if (sStack_d8._M_dataplus._M_p != (pointer)((ulong)pcVar7 & 0xffffffff)) {
        operator_delete(sStack_d8._M_dataplus._M_p);
      }
      if (sStack_b8._M_dataplus._M_p != "vhsiz") {
        operator_delete(sStack_b8._M_dataplus._M_p);
      }
      _Unwind_Resume(extraout_RAX);
    }
    sVar5 = fread(&local_54,0x1c,1,__stream_00);
    if (sVar5 != 0) {
      local_38 = __stream_00;
      do {
        fseek(__stream,CONCAT44(uStack_4c,local_50),0);
        uVar2 = local_54;
        lVar1 = CONCAT44(uStack_44,local_48);
        if (0 < lVar1) {
          lVar8 = 0;
          do {
            fread(&local_60,0xc,1,__stream);
            printf("%d, %d, %d, %.10e\n",(double)local_58,(ulong)uVar2,(ulong)local_60,
                   (ulong)local_5c);
            lVar8 = lVar8 + 0xc;
          } while (lVar8 < lVar1);
        }
        __stream_00 = local_38;
        sVar5 = fread(&local_54,0x1c,1,local_38);
      } while (sVar5 != 0);
    }
    fclose(__stream);
    fclose(__stream_00);
  }
  else {
    fread(&local_60,4,1,_stdin);
    sVar5 = fread(&local_54,0x10,1,_stdin);
    if ((int)sVar5 != 0) {
      do {
        printf("%d, %d, %d, %.10e\n",(double)local_48,(ulong)local_54,(ulong)local_50,
               (ulong)uStack_4c);
        sVar5 = fread(&local_54,0x10,1,_stdin);
      } while ((int)sVar5 != 0);
    }
  }
  return;
}

Assistant:

void doit(bool skipheader, bool index_file)
{

	if (skipheader == false) {
		printf("vulnerability_id,intensity_bin_id,damage_bin_id,"
		       "probability\n");
	}

	if (index_file) {

		const char *binFileName = "vulnerability.bin";
		const char *idxFileName = "vulnerability.idx";
		FILE *finx = fopen(binFileName, "rb");
		FILE *finy = fopen(idxFileName, "rb");
		if (finy == nullptr) {
			fprintf(stderr,
				"FATAL: Vulnerability idx open failed\n");
			exit(EXIT_FAILURE);
		}

		VulnerabilityIndex idx;
		size_t i = fread(&idx, sizeof(idx), 1, finy);
		while (i != 0) {
			flseek(finx, idx.offset, SEEK_SET);
			printrows(idx.vulnerability_id, finx, idx.size);
			i = fread(&idx, sizeof(idx), 1, finy);
		}

		fclose(finx);
		fclose(finy);

	} else {

		int damage_bins;
		// Drop the bins
		fread(&damage_bins, sizeof(damage_bins), 1, stdin);

		Vulnerability q;
		int i = fread(&q, sizeof(q), 1, stdin);
		while (i != 0) {
			printf("%d, %d, %d, %.10e\n", q.vulnerability_id,
			       q.intensity_bin_id, q.damage_bin_id,
			       q.probability);
			i = fread(&q, sizeof(q), 1, stdin);
		}

	}

}